

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

bool __thiscall mp::internal::SolverAppOptionParser::ShowSolveResults(SolverAppOptionParser *this)

{
  BasicSolver *pBVar1;
  _Rb_tree_node_base *p_Var2;
  char *format;
  ArgList local_78;
  pointer local_68 [2];
  _Base_ptr local_58;
  _Base_ptr p_Stack_50;
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  
  local_68[0] = (this->solver_->long_name_)._M_dataplus._M_p;
  local_78.types_ = 10;
  local_78.field_1.values_ = (Value *)local_68;
  BasicSolver::Print(this->solver_,(CStringRef)0x392703,&local_78);
  pBVar1 = this->solver_;
  for (p_Var2 = (pBVar1->super_SolveResultRegistry).registry_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(pBVar1->super_SolveResultRegistry).registry_._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    local_68[0] = (pointer)(ulong)p_Var2[1]._M_color;
    local_58 = (_Base_ptr)(ulong)*(_Rb_tree_color *)&p_Var2[1].field_0x4;
    if (p_Var2[1]._M_color == *(_Rb_tree_color *)&p_Var2[1].field_0x4) {
      local_58 = p_Var2[1]._M_parent;
      p_Stack_50 = p_Var2[1]._M_left;
      local_78.types_ = 0xb2;
      format = "\t    {:3}\t{}\n";
    }
    else {
      local_48 = p_Var2[1]._M_parent;
      p_Stack_40 = p_Var2[1]._M_left;
      local_78.types_ = 0xb22;
      format = "\t{:3}-{:3}\t{}\n";
    }
    local_78.field_1.values_ = (Value *)local_68;
    BasicSolver::Print(this->solver_,(CStringRef)format,&local_78);
  }
  return false;
}

Assistant:

bool SolverAppOptionParser::ShowSolveResults() {
  solver_.Print("Solve result table for {}\n", solver_.long_name());
  for (const auto& sr: solver_.GetSolveResultRegistry()) {
    if (sr.isSingle())
      solver_.Print("\t    {:3}\t{}\n", sr.first(), sr.descr());
    else     // range, printing as a header
      solver_.Print("\t{:3}-{:3}\t{}\n",
                    sr.first(), sr.last(), sr.descr());
  }
  return false;
}